

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

X509_OBJECT * x509_object_dup(X509_OBJECT *obj)

{
  X509_OBJECT *a;
  
  a = (X509_OBJECT *)X509_OBJECT_new();
  if (a != (X509_OBJECT *)0x0) {
    a->type = obj->type;
    a->data = *(_union_381 *)&obj->data;
    X509_OBJECT_up_ref_count(a);
  }
  return (X509_OBJECT *)a;
}

Assistant:

static X509_OBJECT *x509_object_dup(const X509_OBJECT *obj) {
  X509_OBJECT *ret = X509_OBJECT_new();
  if (ret == NULL) {
    return NULL;
  }
  ret->type = obj->type;
  ret->data = obj->data;
  X509_OBJECT_up_ref_count(ret);
  return ret;
}